

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O1

int Abc_NtkLevel(Abc_Ntk_t *pNtk)

{
  uint *puVar1;
  ulong uVar2;
  Abc_Obj_t *pAVar3;
  long *plVar4;
  bool bVar5;
  int *piVar6;
  Vec_Ptr_t *pVVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  long lVar14;
  float fVar15;
  float fVar16;
  
  if ((pNtk->pManTime == (Abc_ManTime_t *)0x0) || (pNtk->AndGateDelay <= 0.0)) {
    pVVar7 = pNtk->vCis;
    if (0 < pVVar7->nSize) {
      lVar14 = 0;
      do {
        puVar1 = (uint *)((long)pVVar7->pArray[lVar14] + 0x14);
        *puVar1 = *puVar1 & 0xfff;
        lVar14 = lVar14 + 1;
        pVVar7 = pNtk->vCis;
      } while (lVar14 < pVVar7->nSize);
    }
  }
  else {
    pVVar7 = pNtk->vCis;
    if (0 < pVVar7->nSize) {
      lVar14 = 0;
      do {
        pAVar3 = (Abc_Obj_t *)pVVar7->pArray[lVar14];
        fVar15 = Abc_NodeReadArrivalWorst(pAVar3);
        fVar16 = 0.0;
        if (0.0 <= fVar15) {
          fVar16 = fVar15;
        }
        *(uint *)&pAVar3->field_0x14 =
             *(uint *)&pAVar3->field_0x14 & 0xfff | (int)(fVar16 / pNtk->AndGateDelay) << 0xc;
        lVar14 = lVar14 + 1;
        pVVar7 = pNtk->vCis;
      } while (lVar14 < pVVar7->nSize);
    }
  }
  if ((pNtk->vTravIds).pArray == (int *)0x0) {
    iVar8 = pNtk->vObjs->nSize;
    uVar2 = (long)iVar8 + 500;
    iVar13 = (int)uVar2;
    if ((pNtk->vTravIds).nCap < iVar13) {
      piVar6 = (int *)malloc(uVar2 * 4);
      (pNtk->vTravIds).pArray = piVar6;
      if (piVar6 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pNtk->vTravIds).nCap = iVar13;
    }
    if (-500 < iVar8) {
      memset((pNtk->vTravIds).pArray,0,(uVar2 & 0xffffffff) << 2);
    }
    (pNtk->vTravIds).nSize = iVar13;
  }
  iVar8 = pNtk->nTravIds;
  pNtk->nTravIds = iVar8 + 1;
  if (iVar8 < 0x3fffffff) {
    if (pNtk->nBarBufs == 0) {
      pVVar7 = pNtk->vObjs;
      if (0 < pVVar7->nSize) {
        lVar14 = 0;
        uVar11 = 0;
        uVar12 = 0;
        do {
          pAVar3 = (Abc_Obj_t *)pVVar7->pArray[lVar14];
          if ((pAVar3 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar3->field_0x14 & 0xf) == 7)) {
            Abc_NtkLevel_rec(pAVar3);
            uVar9 = *(uint *)&pAVar3->field_0x14 >> 0xc;
            bVar5 = uVar12 <= uVar9;
            uVar12 = uVar11;
            if (bVar5) {
              uVar12 = uVar9;
              uVar11 = uVar9;
            }
          }
          lVar14 = lVar14 + 1;
          pVVar7 = pNtk->vObjs;
        } while (lVar14 < pVVar7->nSize);
        return uVar12;
      }
    }
    else {
      pVVar7 = pNtk->vCos;
      iVar8 = pVVar7->nSize;
      if (0 < iVar8) {
        uVar12 = 0;
        iVar13 = 0;
        do {
          iVar10 = 0;
          if (iVar13 < pNtk->nBarBufs) {
            iVar10 = iVar8;
          }
          uVar11 = (iVar10 - pNtk->nBarBufs) + iVar13;
          if (((int)uVar11 < 0) || (iVar8 <= (int)uVar11)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          plVar4 = (long *)pVVar7->pArray[uVar11];
          pAVar3 = *(Abc_Obj_t **)
                    (*(long *)(*(long *)(*plVar4 + 0x20) + 8) + (long)*(int *)plVar4[4] * 8);
          Abc_NtkLevel_rec(pAVar3);
          uVar11 = *(uint *)&pAVar3->field_0x14;
          uVar9 = uVar11 >> 0xc;
          if (uVar12 <= uVar9) {
            uVar12 = uVar9;
          }
          if (iVar13 < pNtk->nBarBufs) {
            plVar4 = *(long **)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) +
                               (long)*(int *)plVar4[6] * 8);
            lVar14 = *(long *)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) +
                              (long)*(int *)plVar4[6] * 8);
            *(uint *)(lVar14 + 0x14) = *(uint *)(lVar14 + 0x14) & 0xfff | uVar11 & 0xfffff000;
          }
          iVar13 = iVar13 + 1;
          pVVar7 = pNtk->vCos;
          iVar8 = pVVar7->nSize;
        } while (iVar13 < iVar8);
        return uVar12;
      }
    }
    return 0;
  }
  __assert_fail("p->nTravIds < (1<<30)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
}

Assistant:

int Abc_NtkLevel( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pNode;
    int i, LevelsMax;
    // set the CI levels
    if ( pNtk->pManTime == NULL || pNtk->AndGateDelay <= 0 )
        Abc_NtkForEachCi( pNtk, pNode, i )
            pNode->Level = 0;
    else
        Abc_NtkForEachCi( pNtk, pNode, i )
            pNode->Level = (int)(Abc_MaxFloat(0, Abc_NodeReadArrivalWorst(pNode)) / pNtk->AndGateDelay);
    // perform the traversal
    LevelsMax = 0;
    Abc_NtkIncrementTravId( pNtk );
    if ( pNtk->nBarBufs == 0 )
    {
        Abc_NtkForEachNode( pNtk, pNode, i )
        {
            Abc_NtkLevel_rec( pNode );
            if ( LevelsMax < (int)pNode->Level )
                LevelsMax = (int)pNode->Level;
        }
    }
    else
    {
        Abc_NtkForEachLiPo( pNtk, pNode, i )
        {
            Abc_Obj_t * pDriver = Abc_ObjFanin0(pNode);
            Abc_NtkLevel_rec( pDriver );
            if ( LevelsMax < (int)pDriver->Level )
                LevelsMax = (int)pDriver->Level;
            // transfer the delay
            if ( i < pNtk->nBarBufs )
                Abc_ObjFanout0(Abc_ObjFanout0(pNode))->Level = pDriver->Level;
        }
    }
    return LevelsMax;
}